

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void InitializeMinimumPhaseAnalysis(int fft_size,MinimumPhaseAnalysis *minimum_phase)

{
  undefined8 uVar1;
  double *in;
  fft_complex *padVar2;
  long lVar3;
  fft_plan *pfVar4;
  ulong uVar5;
  fft_plan *pfVar6;
  ulong uVar7;
  byte bVar8;
  fft_plan fStack_68;
  
  bVar8 = 0;
  minimum_phase->fft_size = fft_size;
  uVar5 = (long)fft_size * 8;
  uVar7 = (long)fft_size << 4;
  if (fft_size < 0) {
    uVar5 = 0xffffffffffffffff;
    uVar7 = 0xffffffffffffffff;
  }
  in = (double *)operator_new__(uVar5);
  minimum_phase->log_spectrum = in;
  padVar2 = (fft_complex *)operator_new__(uVar7);
  minimum_phase->minimum_phase_spectrum = padVar2;
  padVar2 = (fft_complex *)operator_new__(uVar7);
  minimum_phase->cepstrum = padVar2;
  fft_plan_dft_r2c_1d(&fStack_68,fft_size,in,padVar2,3);
  pfVar4 = &fStack_68;
  pfVar6 = &minimum_phase->inverse_fft;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined8 *)pfVar4;
    pfVar6->n = (int)uVar1;
    pfVar6->sign = (int)((ulong)uVar1 >> 0x20);
    pfVar4 = (fft_plan *)((long)pfVar4 + ((ulong)bVar8 * -2 + 1) * 8);
    pfVar6 = (fft_plan *)((long)pfVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  fft_plan_dft_1d(&fStack_68,fft_size,minimum_phase->cepstrum,minimum_phase->minimum_phase_spectrum,
                  1,3);
  pfVar4 = &fStack_68;
  pfVar6 = &minimum_phase->forward_fft;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined8 *)pfVar4;
    pfVar6->n = (int)uVar1;
    pfVar6->sign = (int)((ulong)uVar1 >> 0x20);
    pfVar4 = (fft_plan *)((long)pfVar4 + ((ulong)bVar8 * -2 + 1) * 8);
    pfVar6 = (fft_plan *)((long)pfVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  return;
}

Assistant:

void InitializeMinimumPhaseAnalysis(int fft_size,
    MinimumPhaseAnalysis *minimum_phase) {
  minimum_phase->fft_size = fft_size;
  minimum_phase->log_spectrum = new double[fft_size];
  minimum_phase->minimum_phase_spectrum = new fft_complex[fft_size];
  minimum_phase->cepstrum = new fft_complex[fft_size];
  minimum_phase->inverse_fft = fft_plan_dft_r2c_1d(fft_size,
      minimum_phase->log_spectrum, minimum_phase->cepstrum, FFT_ESTIMATE);
  minimum_phase->forward_fft = fft_plan_dft_1d(fft_size,
      minimum_phase->cepstrum, minimum_phase->minimum_phase_spectrum,
      FFT_FORWARD, FFT_ESTIMATE);
}